

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_identitySet_primitive_scanFor
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  intptr_t value;
  sysbvm_tuple_t sVar1;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  value = sysbvm_identitySet_scanFor(*arguments,arguments[1]);
  if (value + 0x800000000000000U >> 0x3c == 0) {
    return value << 4 | 0xc;
  }
  sVar1 = sysbvm_tuple_int64_encodeBig(context,value);
  return sVar1;
}

Assistant:

static sysbvm_tuple_t sysbvm_identitySet_primitive_scanFor(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    return sysbvm_tuple_intptr_encode(context, sysbvm_identitySet_scanFor(arguments[0], arguments[1]));
}